

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Nonnull<const_char_*> pcVar5;
  long lVar6;
  int out_size;
  void *out;
  int local_44;
  void *local_40 [2];
  
  if (size < this->buffer_size_) {
    iVar3 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                      (this,local_40,&local_44);
    cVar1 = (char)iVar3;
    if (cVar1 != '\0') {
      if (local_44 < size) {
        do {
          memcpy(local_40[0],data,(long)local_44);
          iVar3 = local_44;
          lVar6 = (long)local_44;
          iVar4 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                            (this,local_40,&local_44);
          cVar1 = (char)iVar4;
          if (cVar1 == '\0') {
            return false;
          }
          data = (void *)((long)data + lVar6);
          size = size - iVar3;
        } while (local_44 < size);
      }
      memcpy(local_40[0],data,(long)size);
      (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                (this,(ulong)(uint)(local_44 - size));
    }
  }
  else {
    bVar2 = WriteBuffer(this);
    if ((bVar2) &&
       (iVar3 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,data,(ulong)(uint)size), (char)iVar3 != '\0')) {
      if ((long)this->buffer_used_ == 0) {
        pcVar5 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)this->buffer_used_,0,"buffer_used_ == 0");
      }
      if (pcVar5 == (Nonnull<const_char_*>)0x0) {
        this->position_ = this->position_ + (long)size;
        return true;
      }
      WriteAliasedRaw();
    }
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    ABSL_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      break;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}